

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3JsonTableFunctions(sqlite3 *db)

{
  int iVar1;
  ulong uVar2;
  sqlite3_module **ppsVar3;
  
  uVar2 = 0;
  ppsVar3 = &sqlite3JsonTableFunctions::aMod[0].pModule;
  iVar1 = 0;
  while ((uVar2 < 2 && (iVar1 == 0))) {
    iVar1 = sqlite3_create_module
                      (db,((anon_struct_16_2_49b44120 *)(ppsVar3 + -1))->zName,*ppsVar3,(void *)0x0)
    ;
    uVar2 = uVar2 + 1;
    ppsVar3 = ppsVar3 + 2;
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3JsonTableFunctions(sqlite3 *db){
  int rc = SQLITE_OK;
  static const struct {
    const char *zName;
    sqlite3_module *pModule;
  } aMod[] = {
    { "json_each",            &jsonEachModule               },
    { "json_tree",            &jsonTreeModule               },
  };
  unsigned int i;
  for(i=0; i<sizeof(aMod)/sizeof(aMod[0]) && rc==SQLITE_OK; i++){
    rc = sqlite3_create_module(db, aMod[i].zName, aMod[i].pModule, 0);
  }
  return rc;
}